

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

void __thiscall cmFileLockPool::~cmFileLockPool(cmFileLockPool *this)

{
  pointer ppSVar1;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<cmFileLockPool::ScopePool*const*,std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>,false>>
            ((this->FunctionScopes).
             super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->FunctionScopes).
             super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<cmFileLockPool::ScopePool*const*,std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>,false>>
            ((this->FileScopes).
             super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->FileScopes).
             super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  ScopePool::~ScopePool(&this->ProcessScope);
  ppSVar1 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->FileScopes).
                                  super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  ppSVar1 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->FunctionScopes).
                                  super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
    return;
  }
  return;
}

Assistant:

cmFileLockPool::~cmFileLockPool()
{
  cmDeleteAll(this->FunctionScopes);
  cmDeleteAll(this->FileScopes);
}